

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall Fossilize::FeatureFilter::Impl::pnext_chain_is_supported(Impl *this,void *pNext)

{
  VkBool32 VVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  undefined7 extraout_var;
  const_iterator cVar6;
  byte bVar7;
  undefined4 uVar8;
  ulong in_RCX;
  byte bVar9;
  char *pcVar10;
  ulong uVar11;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *clip;
  DeviceQueryInterface *pDVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long lVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image;
  VkPhysicalDeviceFeatures2 pdf2;
  key_type local_148;
  key_type local_120 [7];
  
  if (pNext != (void *)0x0) {
    do {
      paVar16 = &local_120[0].field_2;
      uVar8 = (undefined4)in_RCX;
      iVar4 = *pNext;
      if (0x3b9e3ccf < iVar4) {
        if (0x3b9f948f < iVar4) {
          if (iVar4 < 0x3ba09a49) {
            if (iVar4 < 0x3ba0251a) {
              if (iVar4 == 0x3b9f9490) {
                VVar1 = (this->features).synchronization2.synchronization2;
              }
              else {
                if (iVar4 != 0x3b9fac02) goto LAB_0010ba0d;
LAB_0010ae9b:
                VVar1 = (this->features).graphics_pipeline_library.graphicsPipelineLibrary;
              }
            }
            else {
              if (iVar4 == 0x3ba0251a) {
                if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
                  return false;
                }
                if ((ulong)*(uint *)((long)pNext + 0x10) != 0) {
                  in_RCX = *(ulong *)((long)pNext + 0x18);
                  uVar11 = 0;
                  do {
                    uVar14 = (ulong)*(uint *)(in_RCX + uVar11 * 0x10);
                    if (uVar14 != 0) {
                      uVar15 = 0;
                      do {
                        iVar4 = *(int *)(*(long *)(uVar11 * 0x10 + in_RCX + 8) + uVar15 * 4);
                        if ((5 < iVar4 - 2U) && (iVar4 != 0)) {
                          return false;
                        }
                        uVar15 = uVar15 + 1;
                      } while (uVar14 != uVar15);
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar11 != *(uint *)((long)pNext + 0x10));
                }
                goto LAB_0010b9cb;
              }
              if (iVar4 == 0x3ba034b9) {
                VVar1 = (this->features).depth_clip_control.depthClipControl;
              }
              else {
                if (iVar4 != 0x3ba086c2) goto LAB_0010ba0d;
                VVar1 = (this->features).multisampled_render_to_single_sampled.
                        multisampledRenderToSingleSampled;
              }
            }
          }
          else if (iVar4 < 0x3ba1c711) {
            if (iVar4 == 0x3ba09a49) {
              VVar1 = (this->features).color_write_enable.colorWriteEnable;
            }
            else {
              if (iVar4 != 0x3ba10f79) goto LAB_0010ba0d;
              VVar1 = (this->features).border_color_swizzle.borderColorSwizzle;
            }
          }
          else if (iVar4 == 0x3ba1c711) {
            VVar1 = (this->features).subpass_merge_feedback.subpassMergeFeedback;
          }
          else if (iVar4 == 0x3ba1f5f5) {
            VVar1 = (this->features).maintenance5.maintenance5;
          }
          else {
            if (iVar4 != 0x3ba3ab71) goto LAB_0010ba0d;
            VVar1 = (this->features).depth_clamp_control.depthClampControl;
          }
          goto joined_r0x0010b691;
        }
        if (iVar4 < 0x3b9eaa31) {
          if (iVar4 < 0x3b9e5441) {
            if (iVar4 == 0x3b9e3cd0) {
              if ((this->features).fragment_shading_rate.attachmentFragmentShadingRate == 0) {
                return false;
              }
              if (*(VkAttachmentReference2 **)((long)pNext + 0x10) != (VkAttachmentReference2 *)0x0)
              {
                bVar2 = attachment_reference2_is_supported
                                  (this,*(VkAttachmentReference2 **)((long)pNext + 0x10));
                if (!bVar2) {
                  return false;
                }
                uVar11 = *(ulong *)((long)pNext + 0x18);
                uVar19 = (uint)uVar11;
                uVar20 = (uint)(uVar11 >> 0x20);
                auVar21._0_4_ = -(uint)(uVar19 == 0);
                auVar21._4_4_ = -(uint)(uVar19 == 0);
                auVar21._8_4_ = -(uint)(uVar20 == 0);
                auVar21._12_4_ = -(uint)(uVar20 == 0);
                uVar5 = movmskpd((int)CONCAT71(extraout_var,bVar2),auVar21);
                if ((uVar5 & 1) != 0) {
                  return false;
                }
                auVar23._8_4_ =
                     (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                     width;
                auVar23._12_4_ =
                     (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                     height;
                auVar23._0_8_ = uVar11;
                auVar22._8_8_ = uVar11;
                auVar22._0_4_ =
                     (this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.
                     width;
                auVar22._4_4_ =
                     (this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.
                     height;
                auVar22 = auVar22 ^ _DAT_00113740;
                auVar23 = auVar23 ^ _DAT_00113740;
                auVar24._0_4_ = -(uint)(auVar22._0_4_ < auVar23._0_4_);
                auVar24._4_4_ = -(uint)(auVar22._4_4_ < auVar23._4_4_);
                auVar24._8_4_ = -(uint)(auVar22._8_4_ < auVar23._8_4_);
                auVar24._12_4_ = -(uint)(auVar22._12_4_ < auVar23._12_4_);
                uVar8 = movmskps(uVar8,auVar24);
                if ((char)uVar8 != '\0') {
                  return false;
                }
                if ((byte)((byte)uVar5 >> 1) != 0) {
                  return false;
                }
                uVar14 = (ulong)uVar20;
                if (uVar20 < uVar19) {
                  uVar14 = uVar11;
                }
                if (uVar20 < uVar19) {
                  uVar11 = (ulong)uVar20;
                }
                in_RCX = uVar11 & 0xffffffff;
                if ((this->props).fragment_shading_rate.
                    maxFragmentShadingRateAttachmentTexelSizeAspectRatio <
                    (uint)((uVar14 & 0xffffffff) / in_RCX)) {
                  return false;
                }
              }
            }
            else {
              if (iVar4 != 0x3b9e3cd1) goto LAB_0010ba0d;
              VVar1 = (this->features).fragment_shading_rate.pipelineFragmentShadingRate;
joined_r0x0010b691:
              if (VVar1 == 0) {
                return false;
              }
            }
          }
          else {
            if (iVar4 + 0xc461abbfU < 2) {
              VVar1 = (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead;
              goto joined_r0x0010b691;
            }
            if (iVar4 == 0x3b9e7769) {
              if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
                return false;
              }
              bVar2 = image_layout_is_supported(this,*(VkImageLayout *)((long)pNext + 0x10));
              if (!bVar2) {
                return false;
              }
            }
            else {
              if (iVar4 != 0x3b9e776a) goto LAB_0010ba0d;
              if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
                return false;
              }
              bVar2 = image_layout_is_supported(this,*(VkImageLayout *)((long)pNext + 0x10));
              if (!bVar2) {
                return false;
              }
              bVar2 = image_layout_is_supported(this,*(VkImageLayout *)((long)pNext + 0x14));
              bVar2 = !bVar2;
LAB_0010b5f9:
              if (bVar2) {
                return false;
              }
            }
          }
        }
        else if (iVar4 < 0x3b9f1b7a) {
          if (iVar4 == 0x3b9eaa31) {
            local_120[0]._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"VK_EXT_provoking_vertex","");
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            if (*(int *)((long)pNext + 0x10) == 1) {
              VVar1 = (this->features).provoking_vertex.provokingVertexLast;
              goto joined_r0x0010b691;
            }
          }
          else {
            if (iVar4 != 0x3b9ebdb9) goto LAB_0010ba0d;
            iVar4 = *(int *)((long)pNext + 0x10);
            if ((iVar4 == 1) && ((this->features).line_rasterization.rectangularLines == 0)) {
              return false;
            }
            if ((iVar4 == 2) && ((this->features).line_rasterization.bresenhamLines == 0)) {
              return false;
            }
            if ((iVar4 == 3) && ((this->features).line_rasterization.smoothLines == 0)) {
              return false;
            }
            if (*(int *)((long)pNext + 0x14) == 1) {
              if ((iVar4 == 1) &&
                 ((this->features).line_rasterization.stippledRectangularLines == 0)) {
                return false;
              }
              if ((iVar4 == 2) && ((this->features).line_rasterization.stippledBresenhamLines == 0))
              {
                return false;
              }
              if (iVar4 == 3) {
                VVar1 = (this->features).line_rasterization.stippledSmoothLines;
                goto joined_r0x0010b691;
              }
            }
          }
        }
        else if (iVar4 == 0x3b9f1b7a) {
          local_120[0]._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"VK_EXT_depth_bias_control","");
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
            operator_delete(local_120[0]._M_dataplus._M_p,
                            local_120[0].field_2._M_allocated_capacity + 1);
          }
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            return false;
          }
          if ((*(int *)((long)pNext + 0x10) == 1) &&
             ((this->features).depth_bias_control.leastRepresentableValueForceUnormRepresentation ==
              0)) {
            return false;
          }
          if (*(int *)((long)pNext + 0x10) == 2) {
            VVar1 = (this->features).depth_bias_control.floatRepresentation;
            goto joined_r0x0010b691;
          }
        }
        else {
          if (iVar4 != 0x3b9f2b18) {
            if (iVar4 != 0x3b9f36d0) goto LAB_0010ba0d;
            goto LAB_0010ae9b;
          }
          local_120[0]._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"VK_EXT_custom_border_color","");
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
            operator_delete(local_120[0]._M_dataplus._M_p,
                            local_120[0].field_2._M_allocated_capacity + 1);
          }
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            return false;
          }
          if ((this->features).custom_border_color.customBorderColorWithoutFormat == 0 &&
              *(int *)((long)pNext + 0x20) == 0) {
            return false;
          }
        }
        goto LAB_0010b9cb;
      }
      if (iVar4 < 0x3b9cf898) {
        if (iVar4 < 0x3b9c5489) {
          if (iVar4 < 0x3b9b9908) {
            if (iVar4 == 0x3b9b3762) {
              VVar1 = (this->features).transform_feedback.geometryStreams;
              goto joined_r0x0010b691;
            }
            if (iVar4 != 0x3b9b75e2) goto LAB_0010ba0d;
            if ((this->features).dynamic_rendering.dynamicRendering == 0) {
              return false;
            }
            uVar5 = *(uint *)((long)pNext + 0x14);
            if (uVar5 != 0) {
              uVar11 = 0;
              do {
                iVar4 = *(int *)(*(long *)((long)pNext + 0x18) + uVar11 * 4);
                if ((iVar4 != 0) && (pDVar12 = this->query, pDVar12 != (DeviceQueryInterface *)0x0))
                {
                  cVar3 = (**(code **)(*(long *)pDVar12 + 0x10))(pDVar12,iVar4,0x80);
                  if (cVar3 == '\0') {
                    return false;
                  }
                  uVar5 = *(uint *)((long)pNext + 0x14);
                }
                uVar11 = uVar11 + 1;
                in_RCX = (ulong)uVar5;
              } while (uVar11 < in_RCX);
            }
            if (((*(int *)((long)pNext + 0x20) != 0) &&
                (pDVar12 = this->query, pDVar12 != (DeviceQueryInterface *)0x0)) &&
               (cVar3 = (**(code **)(*(long *)pDVar12 + 0x10))
                                  (pDVar12,*(int *)((long)pNext + 0x20),0x200), cVar3 == '\0')) {
              return false;
            }
            if (((*(int *)((long)pNext + 0x24) != 0) &&
                (pDVar12 = this->query, pDVar12 != (DeviceQueryInterface *)0x0)) &&
               (cVar3 = (**(code **)(*(long *)pDVar12 + 0x10))
                                  (pDVar12,*(int *)((long)pNext + 0x24),0x200), cVar3 == '\0')) {
              return false;
            }
            if (*(uint *)((long)pNext + 0x20) != 0) {
              uVar5 = *(uint *)((long)pNext + 0x24);
              in_RCX = (ulong)uVar5;
              if (uVar5 != 0 && *(uint *)((long)pNext + 0x20) != uVar5) {
                return false;
              }
            }
            if (*(uint *)((long)pNext + 0x10) != 0) {
              uVar5 = (this->props).multiview.maxMultiviewViewCount;
              in_RCX = (ulong)uVar5;
              uVar19 = -1 << ((byte)uVar5 & 0x1f);
              if (0x1f < uVar5) {
                uVar19 = 0;
              }
              if ((uVar19 & *(uint *)((long)pNext + 0x10)) != 0) {
                return false;
              }
            }
          }
          else if (iVar4 == 0x3b9b9908) {
            if ((this->features).multiview.multiview == 0) {
              return false;
            }
            if ((ulong)*(uint *)((long)pNext + 0x10) != 0) {
              uVar5 = (this->props).multiview.maxMultiviewViewCount;
              uVar19 = -1 << ((byte)uVar5 & 0x1f);
              if (0x1f < uVar5) {
                uVar19 = 0;
              }
              in_RCX = 0;
              do {
                if ((*(uint *)(*(long *)((long)pNext + 0x18) + in_RCX * 4) & uVar19) != 0) {
                  return false;
                }
                in_RCX = in_RCX + 1;
              } while (*(uint *)((long)pNext + 0x10) != in_RCX);
            }
            if ((ulong)*(uint *)((long)pNext + 0x30) != 0) {
              uVar5 = (this->props).multiview.maxMultiviewViewCount;
              uVar19 = -1 << ((byte)uVar5 & 0x1f);
              if (0x1f < uVar5) {
                uVar19 = 0;
              }
              in_RCX = 0;
              do {
                if ((*(uint *)(*(long *)((long)pNext + 0x38) + in_RCX * 4) & uVar19) != 0) {
                  return false;
                }
                in_RCX = in_RCX + 1;
              } while (*(uint *)((long)pNext + 0x30) != in_RCX);
            }
          }
          else {
            if (iVar4 != 0x3b9bd3a0) {
              if (iVar4 != 0x3b9c4cb9) goto LAB_0010ba0d;
              pcVar13 = "VK_EXT_discard_rectangles";
              pcVar10 = "";
              goto LAB_0010b4a6;
            }
            local_120[0]._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"VK_EXT_pipeline_robustness","");
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            uVar5 = *(uint *)((long)pNext + 0x10);
            in_RCX = (ulong)uVar5;
            if (((uVar5 == 0) && (*(int *)((long)pNext + 0x1c) == 0)) &&
               (*(int *)((long)pNext + 0x14) == 0)) {
              uVar5 = *(uint *)((long)pNext + 0x18);
              bVar2 = false;
              if (uVar5 != 0 && (this->features).pipeline_robustness.pipelineRobustness == 0) {
                return false;
              }
              pDVar12 = this->query;
              iVar4 = 0;
              if (pDVar12 == (DeviceQueryInterface *)0x0) {
                return false;
              }
LAB_0010b047:
              in_RCX = (ulong)uVar5;
              bVar18 = true;
              if (uVar5 != 3) {
                bVar18 = *(int *)((long)pNext + 0x14) == 3;
              }
            }
            else {
              if ((this->features).pipeline_robustness.pipelineRobustness == 0) {
                return false;
              }
              pDVar12 = this->query;
              if (pDVar12 == (DeviceQueryInterface *)0x0) {
                return false;
              }
              iVar4 = *(int *)((long)pNext + 0x1c);
              bVar2 = iVar4 == 3;
              bVar18 = true;
              if (uVar5 != 3) {
                uVar5 = *(uint *)((long)pNext + 0x18);
                goto LAB_0010b047;
              }
            }
            if (iVar4 == 3) {
LAB_0010b0c8:
              memset(local_120,0,0xf0);
              local_120[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_148.field_2._M_allocated_capacity = 0;
              local_148.field_2._8_8_ = 0;
              local_148._M_dataplus._M_p = (pointer)0x3b9f2730;
              local_148._M_string_length = 0;
              local_120[0]._M_string_length = (size_type)&local_148;
              (**(code **)(*(long *)pDVar12 + 0x20))(pDVar12);
              if (local_148.field_2._M_allocated_capacity._4_4_ == 0) {
                return false;
              }
            }
            else if (iVar4 == 2) {
              memset(local_120,0,0xf0);
              local_120[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_148.field_2._M_allocated_capacity = 0;
              local_148._M_dataplus._M_p = (pointer)0x3b9fe698;
              local_148._M_string_length = 0;
              local_120[0]._M_string_length = (size_type)&local_148;
              (**(code **)(*(long *)pDVar12 + 0x20))(pDVar12);
              if (local_148.field_2._M_allocated_capacity._0_4_ == 0) {
                return false;
              }
              if (bVar2) {
                pDVar12 = this->query;
                goto LAB_0010b0c8;
              }
            }
            if (bVar18) {
              memset(local_120,0,0xf0);
              local_120[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_148.field_2._M_allocated_capacity = 0;
              local_148.field_2._8_8_ = 0;
              local_148._M_dataplus._M_p = (pointer)0x3b9f2730;
              local_148._M_string_length = 0;
              local_120[0]._M_string_length = (size_type)&local_148;
              (**(code **)(*(long *)this->query + 0x20))();
              uVar8 = local_148.field_2._M_allocated_capacity._0_4_;
              goto joined_r0x0010b9c9;
            }
          }
        }
        else if (iVar4 < 0x3b9c9309) {
          if (iVar4 == 0x3b9c5489) {
            pcVar13 = "VK_EXT_conservative_rasterization";
            pcVar10 = "";
LAB_0010b4a6:
            local_120[0]._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,pcVar13,pcVar10);
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
          }
          else {
            if (iVar4 != 0x3b9c5871) goto LAB_0010ba0d;
            if (*(int *)((long)pNext + 0x14) != 0) {
              VVar1 = (this->features).depth_clip.depthClipEnable;
              goto joined_r0x0010b691;
            }
          }
        }
        else if (iVar4 == 0x3b9c9309) {
          local_120[0]._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"VK_KHR_maintenance2","");
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,local_120);
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar5 = this->api_version;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != paVar16) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (uVar5 < 0x401000) {
              return false;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_120[0]._M_dataplus._M_p != paVar16) {
            operator_delete(local_120[0]._M_dataplus._M_p,
                            local_120[0].field_2._M_allocated_capacity + 1);
          }
          if (*(int *)((long)pNext + 0x10) != 0) {
            lVar17 = 8;
            uVar11 = 0;
            do {
              bVar2 = aspect_mask_is_supported
                                (this,*(VkImageAspectFlags *)
                                       (*(long *)((long)pNext + 0x18) + lVar17));
              if (!bVar2) {
                return false;
              }
              uVar11 = uVar11 + 1;
              lVar17 = lVar17 + 0xc;
            } while (uVar11 < *(uint *)((long)pNext + 0x10));
          }
        }
        else if (iVar4 == 0x3b9c930b) {
          local_120[0]._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"VK_KHR_maintenance2","");
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,local_120);
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar5 = this->api_version;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != paVar16) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (uVar5 < 0x401000) {
              return false;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_120[0]._M_dataplus._M_p != paVar16) {
            operator_delete(local_120[0]._M_dataplus._M_p,
                            local_120[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (iVar4 != 0x3b9cc5d1) goto LAB_0010ba0d;
          local_120[0]._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"VK_EXT_sampler_filter_minmax","");
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,local_120);
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            VVar1 = (this->features).vk12.samplerFilterMinmax;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != paVar16) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (VVar1 == 0) {
              return false;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_120[0]._M_dataplus._M_p != paVar16) {
            operator_delete(local_120[0]._M_dataplus._M_p,
                            local_120[0].field_2._M_allocated_capacity + 1);
          }
          if (2 < *(uint *)((long)pNext + 0x10)) {
            return false;
          }
        }
      }
      else {
        if (iVar4 < 0x3b9d3ee8) {
          if (iVar4 < 0x3b9d2b60) {
            if (iVar4 == 0x3b9cf898) {
              pcVar13 = "VK_EXT_sample_locations";
              pcVar10 = "";
              goto LAB_0010b4a6;
            }
            if (iVar4 == 0x3b9cf89a) {
              local_120[0]._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"VK_EXT_sample_locations","");
              cVar6 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)this,local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
                operator_delete(local_120[0]._M_dataplus._M_p,
                                local_120[0].field_2._M_allocated_capacity + 1);
              }
              if (cVar6.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                return false;
              }
              if ((*(int *)((long)pNext + 0x10) == 0) || (*(int *)((long)pNext + 0x34) == 0))
              goto LAB_0010b9cb;
              if ((this->props).sample_locations.maxSampleLocationGridSize.width <
                  *(uint *)((long)pNext + 0x2c)) {
                return false;
              }
              if ((this->props).sample_locations.maxSampleLocationGridSize.height <
                  *(uint *)((long)pNext + 0x30)) {
                return false;
              }
              VVar1 = (this->props).sample_locations.sampleLocationSampleCounts &
                      *(uint *)((long)pNext + 0x28);
            }
            else {
              if (iVar4 != 0x3b9d0c22) goto LAB_0010ba0d;
              VVar1 = (this->features).blend_operation_advanced.advancedBlendCoherentOperations;
            }
          }
          else {
            if (1 < iVar4 + 0xc462d4a0U) {
LAB_0010ba0d:
              pnext_chain_is_supported();
              return false;
            }
            VVar1 = (this->features).ycbcr_conversion.samplerYcbcrConversion;
          }
          goto joined_r0x0010b691;
        }
        if (iVar4 < 0x3b9dd359) {
          if (iVar4 == 0x3b9d3ee8) {
            in_RCX = (ulong)*(uint *)((long)pNext + 0x10);
            if (in_RCX != 0) {
              uVar11 = 0;
              uVar5 = 0;
              do {
                uVar5 = uVar5 | *(uint *)(*(long *)((long)pNext + 0x18) + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (in_RCX != uVar11);
              if (((uVar5 & 2) != 0) &&
                 ((this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending ==
                  0)) {
                return false;
              }
              if (((uVar5 & 4) != 0) &&
                 ((this->features).descriptor_indexing.descriptorBindingPartiallyBound == 0)) {
                return false;
              }
              if ((uVar5 & 8) != 0) {
                VVar1 = (this->features).descriptor_indexing.
                        descriptorBindingVariableDescriptorCount;
                goto joined_r0x0010b691;
              }
            }
          }
          else {
            if (iVar4 != 0x3b9db031) goto LAB_0010ba0d;
            local_120[0]._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"VK_EXT_vertex_attribute_divisor","");
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,local_120);
            if (cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,"VK_KHR_vertex_attribute_divisor","");
              cVar6 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)this,&local_148);
              bVar2 = cVar6.
                      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ._M_cur == (__node_type *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar2 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              return false;
            }
            if ((ulong)*(uint *)((long)pNext + 0x10) != 0) {
              uVar11 = 0;
              bVar9 = 0;
              in_RCX = 0;
              uVar5 = 0;
              do {
                uVar19 = *(uint *)(*(long *)((long)pNext + 0x18) + 4 + uVar11 * 8);
                bVar7 = (byte)in_RCX | uVar19 != 1;
                in_RCX = (ulong)bVar7;
                bVar9 = bVar9 | uVar19 == 0;
                if (uVar19 < uVar5) {
                  uVar19 = uVar5;
                }
                uVar5 = uVar19;
                uVar11 = uVar11 + 1;
              } while (*(uint *)((long)pNext + 0x10) != uVar11);
              if ((this->props).attribute_divisor.maxVertexAttribDivisor < uVar5) {
                return false;
              }
              if ((bool)(bVar9 & (this->features).attribute_divisor.
                                 vertexAttributeInstanceRateZeroDivisor == 0)) {
                return false;
              }
              if ((bVar7 & (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor ==
                           0) != 0) {
                return false;
              }
            }
          }
        }
        else if (iVar4 == 0x3b9dd359) {
          if (this->api_version < 0x402000) {
            local_120[0]._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"VK_KHR_depth_stencil_resolve","");
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
              operator_delete(local_120[0]._M_dataplus._M_p,
                              local_120[0].field_2._M_allocated_capacity + 1);
            }
            if (cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
          }
          if (*(VkAttachmentReference2 **)((long)pNext + 0x18) != (VkAttachmentReference2 *)0x0) {
            bVar2 = attachment_reference2_is_supported
                              (this,*(VkAttachmentReference2 **)((long)pNext + 0x18));
            if (!bVar2) {
              return false;
            }
            uVar5 = *(uint *)((long)pNext + 0x10);
            if ((uVar5 != 0) && (((this->props).ds_resolve.supportedDepthResolveModes & uVar5) == 0)
               ) {
              return false;
            }
            uVar19 = *(uint *)((long)pNext + 0x14);
            in_RCX = (ulong)uVar19;
            if ((uVar19 != 0) &&
               (((this->props).ds_resolve.supportedStencilResolveModes & uVar19) == 0)) {
              return false;
            }
            if (uVar5 == uVar19) {
              bVar2 = uVar5 == 0x10;
              goto LAB_0010b5f9;
            }
            uVar11 = (ulong)(uVar19 != 0) << 2 | 0x11e8;
            if (uVar5 == 0) {
              uVar11 = 0x11e8;
            }
            if (uVar19 == 0x10) {
              return false;
            }
            if (uVar5 == 0x10) {
              return false;
            }
            uVar8 = *(int *)((this->props2).properties.deviceName + (uVar11 - 0x6c));
joined_r0x0010b9c9:
            if (uVar8 == 0) {
              return false;
            }
          }
        }
        else {
          if (iVar4 == 0x3b9e1d92) {
            VVar1 = (this->features).fragment_density.fragmentDensityMap;
            goto joined_r0x0010b691;
          }
          if (iVar4 != 0x3b9e38e9) goto LAB_0010ba0d;
        }
      }
LAB_0010b9cb:
      pNext = *(void **)((long)pNext + 8);
    } while ((int *)pNext != (int *)0x0);
  }
  return true;
}

Assistant:

bool FeatureFilter::Impl::pnext_chain_is_supported(const void *pNext) const
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

		// These are the currently pNext structs which Fossilize serialize.

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			if (!enabled_extensions.count(VK_EXT_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME) &&
			    !enabled_extensions.count(VK_KHR_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME))
				return false;

			auto *divisor = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoEXT *>(pNext);
			bool use_zero_divisor = false;
			bool use_non_identity_divisor = false;
			uint32_t max_divisor = 0;

			for (uint32_t i = 0; i < divisor->vertexBindingDivisorCount; i++)
			{
				if (divisor->pVertexBindingDivisors[i].divisor != 1)
					use_non_identity_divisor = true;
				if (divisor->pVertexBindingDivisors[i].divisor == 0)
					use_zero_divisor = true;
				max_divisor = (std::max)(max_divisor, divisor->pVertexBindingDivisors[i].divisor);
			}

			if (max_divisor > props.attribute_divisor.maxVertexAttribDivisor)
				return false;
			if (use_zero_divisor && !features.attribute_divisor.vertexAttributeInstanceRateZeroDivisor)
				return false;
			if (use_non_identity_divisor && !features.attribute_divisor.vertexAttributeInstanceRateDivisor)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *clip = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			if (clip->depthClipEnable && !features.depth_clip.depthClipEnable)
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (features.transform_feedback.geometryStreams == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			if (features.multiview.multiview == VK_FALSE)
				return false;

			auto *multiview = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);

			for (uint32_t i = 0; i < multiview->subpassCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pViewMasks[i]))
					return false;
			}

			for (uint32_t i = 0; i < multiview->correlationMaskCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pCorrelationMasks[i]))
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *flags = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfo *>(pNext);
			VkDescriptorBindingFlagsEXT flag_union = 0;
			for (uint32_t i = 0; i < flags->bindingCount; i++)
				flag_union |= flags->pBindingFlags[i];

			if ((flag_union & VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingPartiallyBound == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingVariableDescriptorCount == VK_FALSE)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (features.blend_operation_advanced.advancedBlendCoherentOperations == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *line = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
			    features.line_rasterization.rectangularLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
			    features.line_rasterization.bresenhamLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
			    features.line_rasterization.smoothLines == VK_FALSE)
			{
				return false;
			}

			if (line->stippledLineEnable == VK_TRUE)
			{
				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
				    features.line_rasterization.stippledRectangularLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
				    features.line_rasterization.stippledBresenhamLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
				    features.line_rasterization.stippledSmoothLines == VK_FALSE)
				{
					return false;
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			// The details are validated explicitly elsewhere since we need to know the shader create info to deduce correctness.
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;

			auto *lists = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			for (uint32_t i = 0; i < lists->mutableDescriptorTypeListCount; i++)
			{
				for (uint32_t j = 0; j < lists->pMutableDescriptorTypeLists[i].descriptorTypeCount; j++)
				{
					switch (lists->pMutableDescriptorTypeLists[i].pDescriptorTypes[j])
					{
					case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					case VK_DESCRIPTOR_TYPE_SAMPLER:
						break;

					default:
						// Implementation can theoretically support beyond this (and we'd have to query support),
						// but validate against what is required.
						return false;
					}
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilInitialLayout))
				return false;
			if (!image_layout_is_supported(layout->stencilFinalLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			if (api_version < VK_API_VERSION_1_2 && !enabled_extensions.count(VK_KHR_DEPTH_STENCIL_RESOLVE_EXTENSION_NAME))
				return false;

			auto *resolve = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);

			if (!resolve->pDepthStencilResolveAttachment)
				break;

			if (!attachment_reference2_is_supported(*resolve->pDepthStencilResolveAttachment))
				return false;

			if (resolve->depthResolveMode &&
			    (props.ds_resolve.supportedDepthResolveModes & resolve->depthResolveMode) == 0)
				return false;

			if (resolve->stencilResolveMode &&
			    (props.ds_resolve.supportedStencilResolveModes & resolve->stencilResolveMode) == 0)
				return false;

			if (resolve->depthResolveMode != resolve->stencilResolveMode)
			{
				bool use_zero = resolve->depthResolveMode == VK_RESOLVE_MODE_NONE ||
				                resolve->stencilResolveMode == VK_RESOLVE_MODE_NONE;

				auto cond = use_zero ?
				            props.ds_resolve.independentResolveNone :
				            props.ds_resolve.independentResolve;
				if (!cond)
					return false;
			}

			if (resolve->depthResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID ||
			    resolve->stencilResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			if (!features.fragment_shading_rate.attachmentFragmentShadingRate)
				return false;

			auto *attachment = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);

			if (!attachment->pFragmentShadingRateAttachment)
				break;

			if (!attachment_reference2_is_supported(*attachment->pFragmentShadingRateAttachment))
				return false;

			uint32_t width = attachment->shadingRateAttachmentTexelSize.width;
			uint32_t height = attachment->shadingRateAttachmentTexelSize.height;

			if (width == 0 || height == 0)
				return false;

			if (width < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (width > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (height < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.height)
				return false;
			if (height > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.height)
				return false;

			uint32_t higher = (std::max)(width, height);
			uint32_t lower = (std::min)(width, height);
			uint32_t aspect = higher / lower;
			if (aspect > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSizeAspectRatio)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			if (features.dynamic_rendering.dynamicRendering == VK_FALSE)
				return false;

			auto *info = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);

			for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			{
				if (info->pColorAttachmentFormats[i] != VK_FORMAT_UNDEFINED &&
				    !format_is_supported(info->pColorAttachmentFormats[i], VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
				{
					return false;
				}
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->depthAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->stencilAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->depthAttachmentFormat != info->stencilAttachmentFormat)
			{
				return false;
			}

			if (info->viewMask && !multiview_mask_is_supported(info->viewMask))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			if (!features.color_write_enable.colorWriteEnable)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_PROVOKING_VERTEX_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);

			if (info->provokingVertexMode == VK_PROVOKING_VERTEX_MODE_LAST_VERTEX_EXT &&
			    !features.provoking_vertex.provokingVertexLast)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_CUSTOM_BORDER_COLOR_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);

			if (info->format == VK_FORMAT_UNDEFINED &&
			    !features.custom_border_color.customBorderColorWithoutFormat)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLER_FILTER_MINMAX_EXTENSION_NAME) && !features.vk12.samplerFilterMinmax)
				return false;

			auto *info = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			switch (info->reductionMode)
			{
			case VK_SAMPLER_REDUCTION_MODE_MAX:
			case VK_SAMPLER_REDUCTION_MODE_MIN:
			case VK_SAMPLER_REDUCTION_MODE_WEIGHTED_AVERAGE:
				break;

			default:
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;

			auto *info = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			for (uint32_t i = 0; i < info->aspectReferenceCount; i++)
				if (!aspect_mask_is_supported(info->pAspectReferences[i].aspectMask))
					return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_DISCARD_RECTANGLES_EXTENSION_NAME))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			if (!features.synchronization2.synchronization2)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			if (!features.fragment_shading_rate.pipelineFragmentShadingRate)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			// Should also validate formats and all sorts of feature bits, but
			// consider that TODO for now.
			// YcbcrConversionCreateInfo is inlined into a VkSamplerCreateInfo when replaying from a Fossilize archive.
			// Normally, it's not a pNext, but we pretend it is to make capture and replay
			// a bit more sane.
			if (!features.ycbcr_conversion.samplerYcbcrConversion)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			if (features.graphics_pipeline_library.graphicsPipelineLibrary == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			// If count is 0, this is part of dynamic state, so just ignore it.
			if (!info->sampleLocationsEnable || info->sampleLocationsInfo.sampleLocationsCount == 0)
				break;

			if (info->sampleLocationsInfo.sampleLocationGridSize.width > props.sample_locations.maxSampleLocationGridSize.width ||
			    info->sampleLocationsInfo.sampleLocationGridSize.height > props.sample_locations.maxSampleLocationGridSize.height)
			{
				return false;
			}

			if ((props.sample_locations.sampleLocationSampleCounts & info->sampleLocationsInfo.sampleLocationsPerPixel) == 0)
				return false;

			// Sample positions are clamped by implementation.
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			if (!features.depth_clip_control.depthClipControl)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_PIPELINE_ROBUSTNESS_EXTENSION_NAME) == 0)
				return false;
			auto *info = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);

			if ((info->storageBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->images != VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->uniformBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->vertexInputs != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT) &&
			    features.pipeline_robustness.pipelineRobustness == VK_FALSE)
			{
				return false;
			}

			if (!query)
				return false;

			bool need_robust_image =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_EXT;
			bool need_robust_image2 =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
			bool need_robust_buffer2 =
					info->storageBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->vertexInputs == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->uniformBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;

			// From spec:
			// Any component of the implementation (the loader, any enabled layers, and drivers) must skip over,
			// without processing (other than reading the sType and pNext members)
			// any extending structures in the chain not defined by core versions
			// or extensions supported by that component.
			// I.e. it's safe for us to query the struct, even if the extension is not supported.

			if (need_robust_image)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT };
				pdf2.pNext = &robust_image;
				query->physical_device_feature_query(&pdf2);
				if (robust_image.robustImageAccess == VK_FALSE)
					return false;
			}

			if (need_robust_image2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustImageAccess2 == VK_FALSE)
					return false;
			}

			if (need_robust_buffer2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustBufferAccess2 == VK_FALSE)
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			// Actual flags are validated separately.
			if (features.maintenance5.maintenance5 == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (features.subpass_merge_feedback.subpassMergeFeedback == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (features.border_color_swizzle.borderColorSwizzle == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (features.multisampled_render_to_single_sampled.multisampledRenderToSingleSampled == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_DEPTH_BIAS_CONTROL_EXTENSION_NAME) == 0)
				return false;

			auto *info = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT &&
			    features.depth_bias_control.leastRepresentableValueForceUnormRepresentation == VK_FALSE)
				return false;

			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_FLOAT_EXT &&
			    features.depth_bias_control.floatRepresentation == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (features.fragment_density.fragmentDensityMap == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME) == 0)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (features.depth_clamp_control.depthClampControl == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			if (features.dynamic_rendering_local_read.dynamicRenderingLocalRead == VK_FALSE)
				return false;
			break;
		}

		default:
			LOGE("Unrecognized pNext sType: %u. Treating as unsupported.\n", unsigned(base->sType));
			return false;
		}

		pNext = base->pNext;
	}
	return true;
}